

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void __thiscall YAML::Directives::Directives(Directives *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->version).isDefault = true;
  (this->version).major = 1;
  (this->version).minor = 2;
  p_Var1 = &(this->tags)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->tags)._M_t._M_impl = 0;
  *(undefined8 *)&(this->tags)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Directives::Directives() : version{true, 1, 2}, tags{} {}